

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openssl.c
# Opt level: O0

void ossl_close(Curl_cfilter *cf,Curl_easy *data)

{
  long *plVar1;
  ossl_ctx *octx;
  ssl_connect_data *connssl;
  Curl_easy *data_local;
  Curl_cfilter *cf_local;
  
  plVar1 = *(long **)((long)cf->ctx + 0x40);
  if (plVar1[1] != 0) {
    SSL_free((SSL *)plVar1[1]);
    plVar1[1] = 0;
  }
  if (*plVar1 != 0) {
    SSL_CTX_free((SSL_CTX *)*plVar1);
    *plVar1 = 0;
    *(byte *)((long)plVar1 + 0x24) = *(byte *)((long)plVar1 + 0x24) & 0xfe;
  }
  if (plVar1[3] != 0) {
    ossl_bio_cf_method_free((BIO_METHOD *)plVar1[3]);
    plVar1[3] = 0;
  }
  return;
}

Assistant:

static void ossl_close(struct Curl_cfilter *cf, struct Curl_easy *data)
{
  struct ssl_connect_data *connssl = cf->ctx;
  struct ossl_ctx *octx = (struct ossl_ctx *)connssl->backend;

  (void)data;
  DEBUGASSERT(octx);

  if(octx->ssl) {
    SSL_free(octx->ssl);
    octx->ssl = NULL;
  }
  if(octx->ssl_ctx) {
    SSL_CTX_free(octx->ssl_ctx);
    octx->ssl_ctx = NULL;
    octx->x509_store_setup = FALSE;
  }
  if(octx->bio_method) {
    ossl_bio_cf_method_free(octx->bio_method);
    octx->bio_method = NULL;
  }
}